

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0226(ParserTester *this)

{
  ParseOptions parseOpts;
  ParseOptions local_120;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"void x ( int ( * ) [ * ] ) ;",&local_31);
  Expectation::Expectation(&local_100);
  ParseOptions::ParseOptions(&local_120);
  parseOpts.langExts_.translations_.field_0 = local_120.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_120.langDialect_.std_;
  parseOpts._1_7_ = local_120._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_120.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_120.field_2;
  parseOpts._26_6_ = local_120._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0226()
{
    parse("void x ( int ( * ) [ * ] ) ;") ;
}